

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  p_ply_property __s1;
  p_ply_element __s1_00;
  
  uVar2 = (uint)ply->nelements;
  if (0 < (int)uVar2) {
    __s1_00 = ply->element;
    uVar3 = (ulong)(uVar2 & 0x7fffffff);
    do {
      iVar1 = strcmp(__s1_00->name,element_name);
      if (iVar1 == 0) goto LAB_0014860f;
      __s1_00 = __s1_00 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  __s1_00 = (p_ply_element)0x0;
LAB_0014860f:
  if (__s1_00 != (p_ply_element)0x0) {
    uVar2 = (uint)__s1_00->nproperties;
    if (0 < (int)uVar2) {
      __s1 = __s1_00->property;
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      do {
        iVar1 = strcmp(__s1->name,property_name);
        if (iVar1 == 0) goto LAB_0014864b;
        __s1 = __s1 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    __s1 = (p_ply_property)0x0;
LAB_0014864b:
    if (__s1 != (p_ply_property)0x0) {
      __s1->read_cb = read_cb;
      __s1->pdata = pdata;
      __s1->idata = idata;
      return (long)(int)__s1_00->ninstances;
    }
  }
  return 0;
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
        const char* property_name, p_ply_read_cb read_cb,
        void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int) element->ninstances;
}